

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

Status cmSystemTools::CreateLinkQuietly(string *origName,string *newName)

{
  int iVar1;
  char *path;
  char *new_path;
  undefined1 local_1d8 [4];
  int err;
  uv_fs_t req;
  string *newName_local;
  string *origName_local;
  Status status;
  
  req.bufsml[3].len = (size_t)newName;
  path = (char *)std::__cxx11::string::c_str();
  new_path = (char *)std::__cxx11::string::c_str();
  iVar1 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)local_1d8,path,new_path,(uv_fs_cb)0x0);
  cmsys::Status::Status((Status *)&origName_local);
  if (iVar1 != 0) {
    iVar1 = uv_fs_get_system_error((uv_fs_t *)local_1d8);
    origName_local = (string *)cmsys::Status::POSIX(iVar1);
  }
  return (Status)origName_local;
}

Assistant:

cmsys::Status cmSystemTools::CreateLinkQuietly(std::string const& origName,
                                               std::string const& newName)
{
  uv_fs_t req;
  int err =
    uv_fs_link(nullptr, &req, origName.c_str(), newName.c_str(), nullptr);
  cmsys::Status status;
  if (err) {
#if defined(_WIN32)
    status = cmsys::Status::Windows(uv_fs_get_system_error(&req));
#elif UV_VERSION_MAJOR > 1 || (UV_VERSION_MAJOR == 1 && UV_VERSION_MINOR >= 38)
    status = cmsys::Status::POSIX(uv_fs_get_system_error(&req));
#else
    status = cmsys::Status::POSIX(-err);
#endif
  }
  return status;
}